

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void print_char(FILE *f,mir_ulong ch)

{
  ushort **ppuVar1;
  char *__format;
  mir_ulong ch_local;
  FILE *f_local;
  
  if (ch < 0x100) {
    if (((ch == 0x22) || (ch == 0x22)) || (ch == 0x5c)) {
      fprintf((FILE *)f,"\\");
    }
    ppuVar1 = __ctype_b_loc();
    if (((*ppuVar1)[(int)ch] & 0x4000) == 0) {
      fprintf((FILE *)f,"\\%o",ch & 0xffffffff);
    }
    else {
      fprintf((FILE *)f,"%c",ch & 0xffffffff);
    }
  }
  else {
    __format = "\\U%08x";
    if (ch < 0x10000) {
      __format = "\\u%04x";
    }
    fprintf((FILE *)f,__format,ch & 0xffffffff);
  }
  return;
}

Assistant:

static void print_char (FILE *f, mir_ulong ch) {
  if (ch >= 0x100) {
    fprintf (f, ch <= 0xFFFF ? "\\u%04x" : "\\U%08x", (unsigned int) ch);
  } else {
    if (ch == '"' || ch == '\"' || ch == '\\') fprintf (f, "\\");
    if (isprint (ch))
      fprintf (f, "%c", (unsigned int) ch);
    else
      fprintf (f, "\\%o", (unsigned int) ch);
  }
}